

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGen.cxx
# Opt level: O0

string * __thiscall
cmQtAutoGen::AppendFilenameSuffix_abi_cxx11_
          (string *__return_storage_ptr__,cmQtAutoGen *this,string_view filename,string_view suffix)

{
  string_view view;
  string_view view_00;
  string_view view_01;
  size_type __pos;
  size_type sVar1;
  basic_string_view<char,_std::char_traits<char>_> local_148;
  size_type local_138;
  size_t local_130;
  cmAlphaNum local_128;
  basic_string_view<char,_std::char_traits<char>_> local_f8;
  cmAlphaNum local_e8;
  size_type local_b8;
  size_t local_b0;
  cmAlphaNum local_a8;
  char *local_78;
  char *local_70;
  cmAlphaNum local_68;
  size_type local_38;
  size_type dotPos;
  string_view suffix_local;
  string_view filename_local;
  
  suffix_local._M_len = suffix._M_len;
  dotPos = (size_type)filename._M_str;
  suffix_local._M_str = (char *)this;
  local_38 = std::basic_string_view<char,_std::char_traits<char>_>::rfind
                       ((basic_string_view<char,_std::char_traits<char>_> *)&suffix_local._M_str,'.'
                        ,0xffffffffffffffff);
  if (local_38 == 0xffffffffffffffff) {
    local_78 = suffix_local._M_str;
    view_01._M_str = (char *)filename._M_len;
    view_01._M_len = (size_t)suffix_local._M_str;
    local_70 = (char *)filename._M_len;
    cmAlphaNum::cmAlphaNum(&local_68,view_01);
    local_b8 = dotPos;
    local_b0 = suffix_local._M_len;
    view_00._M_str = (char *)suffix_local._M_len;
    view_00._M_len = dotPos;
    cmAlphaNum::cmAlphaNum(&local_a8,view_00);
    cmStrCat<>(__return_storage_ptr__,&local_68,&local_a8);
  }
  else {
    local_f8 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                         ((basic_string_view<char,_std::char_traits<char>_> *)&suffix_local._M_str,0
                          ,local_38);
    cmAlphaNum::cmAlphaNum(&local_e8,local_f8);
    local_138 = dotPos;
    local_130 = suffix_local._M_len;
    view._M_str = (char *)suffix_local._M_len;
    view._M_len = dotPos;
    cmAlphaNum::cmAlphaNum(&local_128,view);
    __pos = local_38;
    sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)&suffix_local._M_str);
    local_148 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                          ((basic_string_view<char,_std::char_traits<char>_> *)&suffix_local._M_str,
                           __pos,sVar1 - local_38);
    cmStrCat<std::basic_string_view<char,std::char_traits<char>>>
              (__return_storage_ptr__,&local_e8,&local_128,&local_148);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmQtAutoGen::AppendFilenameSuffix(cm::string_view filename,
                                              cm::string_view suffix)
{
  auto dotPos = filename.rfind('.');
  if (dotPos == cm::string_view::npos) {
    return cmStrCat(filename, suffix);
  }
  return cmStrCat(filename.substr(0, dotPos), suffix,
                  filename.substr(dotPos, filename.size() - dotPos));
}